

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Br(ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_2a;
  undefined8 uStack_28;
  OpLayoutBr data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  ByteCodeLabel local_18;
  OpCode local_12;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_18 = labelID;
  local_12 = op;
  _labelID_local = this;
  CheckOpen(this);
  op_00 = local_12;
  OpLayoutType::OpLayoutType((OpLayoutType *)((long)&offsetOfRelativeJumpOffsetFromEnd + 4),Br);
  CheckOp(this,op_00,offsetOfRelativeJumpOffsetFromEnd._4_4_);
  CheckLabel(this,local_18);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_12);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x304,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  uStack_28 = 2;
  local_2a = 2;
  Data::Encode(&this->m_byteCodeData,local_12,&local_2a,2,this);
  AddJumpOffset(this,local_12,local_18,2);
  return;
}

Assistant:

void ByteCodeWriter::Br(OpCode op, ByteCodeLabel labelID)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Br);
        CheckLabel(labelID);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBr) - offsetof(OpLayoutBr, RelativeJumpOffset);
        OpLayoutBr data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }